

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O2

EStatusCode __thiscall OpenTypeFileInput::ReadOS2(OpenTypeFileInput *this)

{
  OS2Table *outValue;
  OpenTypePrimitiveReader *this_00;
  _Base_ptr p_Var1;
  EStatusCode EVar2;
  iterator iVar3;
  LongFilePositionType LVar4;
  OpenTypeFileInput *this_01;
  int i;
  long lVar5;
  unsigned_long local_38;
  
  outValue = &this->mOS2;
  EVar2 = eSuccess;
  this_01 = (OpenTypeFileInput *)outValue;
  memset(outValue,0,0x88);
  local_38 = GetTag(this_01,"OS/2");
  iVar3 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_TableEntry>,_std::_Select1st<std::pair<const_unsigned_long,_TableEntry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TableEntry>_>_>
          ::find(&(this->mTables)._M_t,&local_38);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->mTables)._M_t._M_impl.super__Rb_tree_header) {
    this->mOS2Exists = false;
  }
  else {
    this->mOS2Exists = true;
    this_00 = &this->mPrimitivesReader;
    OpenTypePrimitiveReader::SetOffset(this_00,(LongFilePositionType)iVar3._M_node[1]._M_left);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&outValue->Version);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).AvgCharWidth);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).WeightClass);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).WidthClass);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).fsType);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SubscriptXSize);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SubscriptYSize);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SubscriptXOffset);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SubscriptYOffset);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SuperscriptXSize);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SuperscriptYSize);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SuperscriptXOffset);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).SuperscriptYOffset);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).StrikeoutSize);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).StrikeoutPosition);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).FamilyClass);
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      OpenTypePrimitiveReader::ReadBYTE(this_00,(this->mOS2).Panose + lVar5);
    }
    OpenTypePrimitiveReader::ReadULONG(this_00,&(this->mOS2).UnicodeRange1);
    OpenTypePrimitiveReader::ReadULONG(this_00,&(this->mOS2).UnicodeRange2);
    OpenTypePrimitiveReader::ReadULONG(this_00,&(this->mOS2).UnicodeRange3);
    OpenTypePrimitiveReader::ReadULONG(this_00,&(this->mOS2).UnicodeRange4);
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      OpenTypePrimitiveReader::ReadCHAR(this_00,(this->mOS2).AchVendID + lVar5);
    }
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).FSSelection);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).FirstCharIndex);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).LastCharIndex);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).TypoAscender);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).TypoDescender);
    OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).TypoLineGap);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).WinAscent);
    OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).WinDescent);
    p_Var1 = iVar3._M_node[1]._M_right;
    LVar4 = OpenTypePrimitiveReader::GetCurrentPosition(this_00);
    if ((_Base_ptr)((LVar4 - (long)iVar3._M_node[1]._M_left) + 0x12) <= p_Var1) {
      OpenTypePrimitiveReader::ReadULONG(this_00,&(this->mOS2).CodePageRange1);
      OpenTypePrimitiveReader::ReadULONG(this_00,&(this->mOS2).CodePageRange2);
      OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).XHeight);
      OpenTypePrimitiveReader::ReadSHORT(this_00,&(this->mOS2).CapHeight);
      OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).DefaultChar);
      OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).BreakChar);
      OpenTypePrimitiveReader::ReadUSHORT(this_00,&(this->mOS2).MaxContext);
    }
    EVar2 = OpenTypePrimitiveReader::GetInternalState(this_00);
  }
  return EVar2;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadOS2()
{
	memset(&mOS2,0,sizeof(OS2Table));

	ULongToTableEntryMap::iterator it = mTables.find(GetTag("OS/2"));
	if(it == mTables.end())
	{
        mOS2Exists = false;
        return eSuccess;
	}
    
    mOS2Exists = true;

	mPrimitivesReader.SetOffset(it->second.Offset);


	mPrimitivesReader.ReadUSHORT(mOS2.Version);
	mPrimitivesReader.ReadSHORT(mOS2.AvgCharWidth);
	mPrimitivesReader.ReadUSHORT(mOS2.WeightClass);
	mPrimitivesReader.ReadUSHORT(mOS2.WidthClass);
	mPrimitivesReader.ReadUSHORT(mOS2.fsType);

	mPrimitivesReader.ReadSHORT(mOS2.SubscriptXSize);
	mPrimitivesReader.ReadSHORT(mOS2.SubscriptYSize);
	mPrimitivesReader.ReadSHORT(mOS2.SubscriptXOffset);
	mPrimitivesReader.ReadSHORT(mOS2.SubscriptYOffset);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptXSize);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptYSize);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptXOffset);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptYOffset);
	mPrimitivesReader.ReadSHORT(mOS2.StrikeoutSize);
	mPrimitivesReader.ReadSHORT(mOS2.StrikeoutPosition);
	mPrimitivesReader.ReadSHORT(mOS2.FamilyClass);
	for(int i=0; i <10; ++i)
		mPrimitivesReader.ReadBYTE(mOS2.Panose[i]);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange1);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange2);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange3);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange4);
	for(int i=0; i <4; ++i)
		mPrimitivesReader.ReadCHAR(mOS2.AchVendID[i]);
	mPrimitivesReader.ReadUSHORT(mOS2.FSSelection);
	mPrimitivesReader.ReadUSHORT(mOS2.FirstCharIndex);
	mPrimitivesReader.ReadUSHORT(mOS2.LastCharIndex);
	mPrimitivesReader.ReadSHORT(mOS2.TypoAscender);
	mPrimitivesReader.ReadSHORT(mOS2.TypoDescender);
	mPrimitivesReader.ReadSHORT(mOS2.TypoLineGap);
	mPrimitivesReader.ReadUSHORT(mOS2.WinAscent);
	mPrimitivesReader.ReadUSHORT(mOS2.WinDescent);

	// version 1 OS/2 table may end here [see that there's enough to continue]
	if(it->second.Length >= (mPrimitivesReader.GetCurrentPosition() - it->second.Offset) + 18)
	{
		mPrimitivesReader.ReadULONG(mOS2.CodePageRange1);
		mPrimitivesReader.ReadULONG(mOS2.CodePageRange2);
		mPrimitivesReader.ReadSHORT(mOS2.XHeight);
		mPrimitivesReader.ReadSHORT(mOS2.CapHeight);
		mPrimitivesReader.ReadUSHORT(mOS2.DefaultChar);
		mPrimitivesReader.ReadUSHORT(mOS2.BreakChar);
		mPrimitivesReader.ReadUSHORT(mOS2.MaxContext);
	}
	return mPrimitivesReader.GetInternalState();	
}